

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# overload_1.cxx
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  Int *pIVar2;
  Int local_34;
  Int local_30;
  Int local_2c;
  
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6fd);
  std::endl<char,std::char_traits<char>>(poVar1);
  Int::Int(&local_30,5);
  local_2c.value = local_30.value;
  Int::operator_cast_to_int(&local_2c);
  Int::operator_cast_to_double(&local_2c);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_720);
  std::endl<char,std::char_traits<char>>(poVar1);
  Int::Int(&local_34,0);
  local_2c.value = local_34.value;
  Int::Int(&local_30,0);
  local_34 = Int::operator++(&local_2c,0);
  Int::operator_cast_to_int(&local_34);
  pIVar2 = Int::operator++(&local_2c);
  Int::operator_cast_to_int(pIVar2);
  local_34.value = local_2c.value;
  local_2c.value = local_2c.value + -1;
  Int::operator_cast_to_int(&local_34);
  local_2c.value = local_2c.value + -1;
  Int::operator_cast_to_int(&local_2c);
  pIVar2 = Int::operator++(&local_30);
  Int::operator_cast_to_int(pIVar2);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_736);
  std::endl<char,std::char_traits<char>>(poVar1);
  Int::Int(&local_34,5);
  local_2c.value = local_34.value;
  Int::Int(&local_34,5);
  local_30.value = local_34.value;
  pIVar2 = Int::operator+(&local_2c,&local_30);
  Int::operator_cast_to_int(pIVar2);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main() {
    int a = 5, b = 3, c = 10;
    double d = 12.3;
    Int origin_int_1, origin_int_2;

    /*** 代入&返却 ***/
    std::cout << "-------代入と返却-------" << std::endl;
    origin_int_1 = a; //代入
    origin_int_2 = origin_int_1; //代入
    b = origin_int_1; //int型で返却
    d = origin_int_1; //double型で返却

    std::cout << std::endl << std::endl << std::endl << std::endl;


    /*** インクリメント&デクリメント ***/
    std::cout << "-------インクリメントとデクリメント-------" << std::endl;
    origin_int_1 = 0;
    origin_int_2 = 0;
    a = origin_int_1++;
    a = ++origin_int_1;
    b = origin_int_1--;
    b = --origin_int_1;

    b = ++origin_int_2;
    std::cout << std::endl << std::endl << std::endl << std::endl;

    /*** 加算&減算 ***/
    std::cout << "-------加算&減算-------" << std::endl;
    a = 0;
    origin_int_1 = 5;
    origin_int_2 = 5;
    a = origin_int_1 + origin_int_2;
    std::cout << std::endl << std::endl << std::endl << std::endl;

    return 0;
}